

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall CPP::WriteInitialization::acceptAction(WriteInitialization *this,DomAction *node)

{
  Driver *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  iterator iVar5;
  iterator iVar6;
  QTextStream *pQVar7;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<DomProperty_*> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (node->m_has_attr_menu == false) {
    local_48.size = -0x5555555555555556;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    Driver::findOrInsertAction((QString *)&local_48,this->m_driver,node);
    local_68.size = -0x5555555555555556;
    local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pDVar1 = this->m_driver;
    iVar5 = QList<DomWidget_*>::end(&(this->m_widgetChain).super_QList<DomWidget_*>);
    Driver::findOrInsertWidget((QString *)&local_68,pDVar1,iVar5.i[-1]);
    iVar6 = QList<DomActionGroup_*>::end(&(this->m_actionGroupChain).super_QList<DomActionGroup_*>);
    if (iVar6.i[-1] != (DomActionGroup *)0x0) {
      pDVar1 = this->m_driver;
      iVar6 = QList<DomActionGroup_*>::end
                        (&(this->m_actionGroupChain).super_QList<DomActionGroup_*>);
      Driver::findOrInsertActionGroup((QString *)&local_88,pDVar1,iVar6.i[-1]);
      qVar4 = local_68.size;
      pcVar3 = local_68.ptr;
      pDVar2 = local_68.d;
      local_68.d = local_88.d;
      local_68.ptr = local_88.ptr;
      local_88.d = pDVar2;
      local_88.ptr = pcVar3;
      local_68.size = local_88.size;
      local_88.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    pQVar7 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_48);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7," = ");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)language::operatorNew);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"QAction(");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_68);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,')');
    QTextStream::operator<<(pQVar7,(QString *)language::eol);
    latin1.m_data = "QAction";
    latin1.m_size = 7;
    QString::QString((QString *)&local_88,latin1);
    local_a0.d = (node->m_property).d.d;
    local_a0.ptr = (node->m_property).d.ptr;
    local_a0.size = (node->m_property).d.size;
    if (local_a0.d != (Data *)0x0) {
      LOCK();
      ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeProperties(this,(QString *)&local_48,(QString *)&local_88,(DomPropertyList *)&local_a0,0);
    QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::acceptAction(DomAction *node)
{
    if (node->hasAttributeMenu())
        return;

    const QString actionName = m_driver->findOrInsertAction(node);
    QString varName = m_driver->findOrInsertWidget(m_widgetChain.top());

    if (m_actionGroupChain.top())
        varName = m_driver->findOrInsertActionGroup(m_actionGroupChain.top());

    m_output << m_indent << actionName << " = " << language::operatorNew
        << "QAction(" << varName << ')' << language::eol;
    writeProperties(actionName, "QAction"_L1, node->elementProperty());
}